

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEdge.c
# Opt level: O0

Vec_Int_t * Gia_ManEdgeToArray(Gia_Man_t *p)

{
  int iVar1;
  int iVar2;
  Vec_Int_t *p_00;
  Vec_Int_t *vArray;
  int iFanin;
  int iObj;
  Gia_Man_t *p_local;
  
  p_00 = Vec_IntAlloc(1000);
  if ((p->vEdge1 == (Vec_Int_t *)0x0) || (p->vEdge2 == (Vec_Int_t *)0x0)) {
    __assert_fail("p->vEdge1 && p->vEdge2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEdge.c"
                  ,0x5c,"Vec_Int_t *Gia_ManEdgeToArray(Gia_Man_t *)");
  }
  iVar1 = Vec_IntSize(p->vEdge1);
  iVar2 = Gia_ManObjNum(p);
  if (iVar1 != iVar2) {
    __assert_fail("Vec_IntSize(p->vEdge1) == Gia_ManObjNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEdge.c"
                  ,0x5d,"Vec_Int_t *Gia_ManEdgeToArray(Gia_Man_t *)");
  }
  iVar1 = Vec_IntSize(p->vEdge2);
  iVar2 = Gia_ManObjNum(p);
  if (iVar1 == iVar2) {
    vArray._4_4_ = 0;
    while( true ) {
      iVar1 = Gia_ManObjNum(p);
      if (iVar1 <= vArray._4_4_) break;
      iVar1 = Vec_IntEntry(p->vEdge1,vArray._4_4_);
      if ((iVar1 != 0) && (iVar1 < vArray._4_4_)) {
        Vec_IntPushTwo(p_00,iVar1,vArray._4_4_);
      }
      iVar1 = Vec_IntEntry(p->vEdge2,vArray._4_4_);
      if ((iVar1 != 0) && (iVar1 < vArray._4_4_)) {
        Vec_IntPushTwo(p_00,iVar1,vArray._4_4_);
      }
      vArray._4_4_ = vArray._4_4_ + 1;
    }
    return p_00;
  }
  __assert_fail("Vec_IntSize(p->vEdge2) == Gia_ManObjNum(p)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEdge.c"
                ,0x5e,"Vec_Int_t *Gia_ManEdgeToArray(Gia_Man_t *)");
}

Assistant:

Vec_Int_t * Gia_ManEdgeToArray( Gia_Man_t * p )
{
    int iObj, iFanin;
    Vec_Int_t * vArray = Vec_IntAlloc( 1000 );
    assert( p->vEdge1 && p->vEdge2 );
    assert( Vec_IntSize(p->vEdge1) == Gia_ManObjNum(p) );
    assert( Vec_IntSize(p->vEdge2) == Gia_ManObjNum(p) );
    for ( iObj = 0; iObj < Gia_ManObjNum(p); iObj++ )
    {
        iFanin = Vec_IntEntry( p->vEdge1, iObj );
        if ( iFanin && iFanin < iObj )
            Vec_IntPushTwo( vArray, iFanin, iObj );
        iFanin = Vec_IntEntry( p->vEdge2, iObj );
        if ( iFanin && iFanin < iObj )
            Vec_IntPushTwo( vArray, iFanin, iObj );
    }
    return vArray;
}